

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O2

int EstimateStripByteCounts(TIFF *tif,TIFFDirEntry *dir,uint16_t dircount)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint64_t *puVar6;
  uint64_t uVar7;
  toff_t tVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint16_t *puVar16;
  bool bVar17;
  
  iVar5 = _TIFFFillStrilesInternal(tif,0);
  iVar12 = -1;
  if (iVar5 != 0) {
    puVar6 = (tif->tif_dir).td_stripbytecount_p;
    if (puVar6 != (uint64_t *)0x0) {
      _TIFFfreeExt(tif,puVar6);
    }
    puVar6 = (uint64_t *)
             _TIFFCheckMalloc(tif,(ulong)(tif->tif_dir).td_nstrips,8,"for \"StripByteCounts\" array"
                             );
    (tif->tif_dir).td_stripbytecount_p = puVar6;
    if (puVar6 != (uint64_t *)0x0) {
      if ((tif->tif_dir).td_compression == 1) {
        if ((tif->tif_flags & 0x400) == 0) {
          uVar7 = TIFFScanlineSize64(tif);
          uVar9 = (tif->tif_dir).td_nstrips;
          uVar11 = (ulong)(tif->tif_dir).td_imagelength / (ulong)(tif->tif_dir).td_stripsperimage;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar7;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar11;
          for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
            if (SUB168(auVar1 * auVar3,8) != 0) {
              return -1;
            }
            (tif->tif_dir).td_stripbytecount_p[uVar14] = uVar7 * uVar11;
          }
        }
        else {
          uVar7 = TIFFTileSize64(tif);
          uVar9 = (tif->tif_dir).td_nstrips;
          for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
            (tif->tif_dir).td_stripbytecount_p[uVar11] = uVar7;
          }
        }
      }
      else {
        tVar8 = (*tif->tif_sizeproc)(tif->tif_clientdata);
        uVar9 = tif->tif_flags & 0x80000;
        lVar15 = ((ulong)(uVar9 >> 0x10) + 0xc) * (ulong)dircount;
        uVar11 = lVar15 + 0xe;
        if (uVar9 != 0) {
          uVar11 = lVar15 + 0x20;
        }
        puVar16 = &dir->tdir_type;
        while (bVar17 = dircount != 0, dircount = dircount - 1, bVar17) {
          uVar9 = TIFFDataWidth((uint)*puVar16);
          if (uVar9 == 0) {
            TIFFErrorExtR(tif,"EstimateStripByteCounts",
                          "Cannot determine size of unknown tag type %u",(ulong)*puVar16);
            return -1;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = CONCAT44(0,uVar9);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(puVar16 + 3);
          if (SUB168(auVar2 * auVar4,8) != 0) {
            return -1;
          }
          uVar13 = *(ulong *)(puVar16 + 3) * CONCAT44(0,uVar9);
          uVar14 = 0;
          if (8 < uVar13) {
            uVar14 = uVar13;
          }
          uVar10 = 0;
          if (4 < uVar13) {
            uVar10 = uVar13;
          }
          if ((tif->tif_flags & 0x80000) == 0) {
            uVar14 = uVar10;
          }
          bVar17 = CARRY8(uVar11,uVar14);
          uVar11 = uVar11 + uVar14;
          if (bVar17) {
            return -1;
          }
          puVar16 = puVar16 + 0x10;
        }
        uVar14 = 0;
        if (uVar11 <= tVar8) {
          uVar14 = uVar11;
        }
        uVar14 = tVar8 - uVar14;
        if ((tif->tif_dir).td_planarconfig == 2) {
          uVar14 = uVar14 / (tif->tif_dir).td_samplesperpixel;
        }
        uVar9 = (tif->tif_dir).td_nstrips;
        for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
          (tif->tif_dir).td_stripbytecount_p[uVar11] = uVar14;
        }
        uVar9 = uVar9 - 1;
        puVar6 = (tif->tif_dir).td_stripbytecount_p;
        uVar11 = (tif->tif_dir).td_stripoffset_p[uVar9];
        uVar14 = puVar6[uVar9];
        if (CARRY8(uVar14,uVar11)) {
          return -1;
        }
        if (tVar8 < uVar14 + uVar11) {
          uVar7 = 0;
          if (uVar11 <= tVar8) {
            uVar7 = tVar8 - uVar11;
          }
          puVar6[uVar9] = uVar7;
        }
      }
      uVar9 = (tif->tif_dir).td_fieldsset[0];
      (tif->tif_dir).td_fieldsset[0] = uVar9 | 0x1000000;
      iVar12 = 1;
      if ((uVar9 >> 0x11 & 1) == 0) {
        (tif->tif_dir).td_rowsperstrip = (tif->tif_dir).td_imagelength;
      }
    }
  }
  return iVar12;
}

Assistant:

static int EstimateStripByteCounts(TIFF *tif, TIFFDirEntry *dir,
                                   uint16_t dircount)
{
    static const char module[] = "EstimateStripByteCounts";

    TIFFDirEntry *dp;
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t strip;

    /* Do not try to load stripbytecount as we will compute it */
    if (!_TIFFFillStrilesInternal(tif, 0))
        return -1;

    if (td->td_stripbytecount_p)
        _TIFFfreeExt(tif, td->td_stripbytecount_p);
    td->td_stripbytecount_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripByteCounts\" array");
    if (td->td_stripbytecount_p == NULL)
        return -1;

    if (td->td_compression != COMPRESSION_NONE)
    {
        uint64_t space;
        uint64_t filesize;
        uint16_t n;
        filesize = TIFFGetFileSize(tif);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
            space = sizeof(TIFFHeaderClassic) + 2 + dircount * 12 + 4;
        else
            space = sizeof(TIFFHeaderBig) + 8 + dircount * 20 + 8;
        /* calculate amount of space used by indirect values */
        for (dp = dir, n = dircount; n > 0; n--, dp++)
        {
            uint32_t typewidth;
            uint64_t datasize;
            typewidth = TIFFDataWidth((TIFFDataType)dp->tdir_type);
            if (typewidth == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Cannot determine size of unknown tag type %" PRIu16,
                    dp->tdir_type);
                return -1;
            }
            if (dp->tdir_count > UINT64_MAX / typewidth)
                return -1;
            datasize = (uint64_t)typewidth * dp->tdir_count;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                if (datasize <= 4)
                    datasize = 0;
            }
            else
            {
                if (datasize <= 8)
                    datasize = 0;
            }
            if (space > UINT64_MAX - datasize)
                return -1;
            space += datasize;
        }
        if (filesize < space)
            /* we should perhaps return in error ? */
            space = filesize;
        else
            space = filesize - space;
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
            space /= td->td_samplesperpixel;
        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = space;
        /*
         * This gross hack handles the case were the offset to
         * the last strip is past the place where we think the strip
         * should begin.  Since a strip of data must be contiguous,
         * it's safe to assume that we've overestimated the amount
         * of data in the strip and trim this number back accordingly.
         */
        strip--;
        if (td->td_stripoffset_p[strip] >
            UINT64_MAX - td->td_stripbytecount_p[strip])
            return -1;
        if (td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip] >
            filesize)
        {
            if (td->td_stripoffset_p[strip] >= filesize)
            {
                /* Not sure what we should in that case... */
                td->td_stripbytecount_p[strip] = 0;
            }
            else
            {
                td->td_stripbytecount_p[strip] =
                    filesize - td->td_stripoffset_p[strip];
            }
        }
    }
    else if (isTiled(tif))
    {
        uint64_t bytespertile = TIFFTileSize64(tif);

        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = bytespertile;
    }
    else
    {
        uint64_t rowbytes = TIFFScanlineSize64(tif);
        uint32_t rowsperstrip = td->td_imagelength / td->td_stripsperimage;
        for (strip = 0; strip < td->td_nstrips; strip++)
        {
            if (rowbytes > 0 && rowsperstrip > UINT64_MAX / rowbytes)
                return -1;
            td->td_stripbytecount_p[strip] = rowbytes * rowsperstrip;
        }
    }
    TIFFSetFieldBit(tif, FIELD_STRIPBYTECOUNTS);
    if (!TIFFFieldSet(tif, FIELD_ROWSPERSTRIP))
        td->td_rowsperstrip = td->td_imagelength;
    return 1;
}